

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

BOOL __thiscall Js::JavascriptFunction::IsEnumerable(JavascriptFunction *this,PropertyId propertyId)

{
  bool bVar1;
  PropertyIndex PVar2;
  BOOL BVar3;
  
  PVar2 = DynamicObject::GetPropertyIndex(&this->super_DynamicObject,propertyId);
  if ((PVar2 == 0xffff) && ((propertyId | 2U) == 0x1cf)) {
    bVar1 = HasRestrictedProperties(this);
    if (bVar1) {
      return 0;
    }
  }
  BVar3 = DynamicObject::IsEnumerable(&this->super_DynamicObject,propertyId);
  return BVar3;
}

Assistant:

BOOL JavascriptFunction::IsEnumerable(PropertyId propertyId)
    {
        if (DynamicObject::GetPropertyIndex(propertyId) == Constants::NoSlot)
        {
            switch (propertyId)
            {
            case PropertyIds::caller:
            case PropertyIds::arguments:
                if (this->HasRestrictedProperties())
                {
                    return false;
                }
                break;
            }
        }
        return DynamicObject::IsEnumerable(propertyId);
    }